

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

Vec_Int_t * Ga2_ManRefine(Ga2_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  Abc_Cex_t *pAVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  
  if (p->pPars->fAddLayer == 0) {
    Ga2_GlaPrepareCexAndMap(p,&pCex,&vMap);
    p_00 = Rnm_ManRefine(p->pRnm,pCex,vMap,p->pPars->fPropFanout,p->pPars->fNewRefine,1);
    Abc_CexFree(pCex);
    if (p_00->nSize == 0) {
      Vec_IntFree(p_00);
      Abc_CexFreeP(&p->pGia->pCexSeq);
      pAVar5 = Ga2_ManDeriveCex(p,vMap);
      p->pGia->pCexSeq = pAVar5;
      Vec_IntFree(vMap);
      return (Vec_Int_t *)0x0;
    }
    Vec_IntFree(vMap);
    iVar7 = 0;
    for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
      pGVar1 = p->pGia;
      iVar3 = Vec_IntEntry(p_00,iVar2);
      pGVar4 = Gia_ManObj(pGVar1,iVar3);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar3 = Ga2_ObjIsAbs(p,pGVar4);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjId(p->pGia,pGVar4);
        Vec_IntWriteEntry(p_00,iVar7,iVar3);
        iVar7 = iVar7 + 1;
      }
    }
    Vec_IntShrink(p_00,iVar7);
    iVar7 = 0;
    while (iVar2 = p_00->nSize, iVar7 < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p_00,iVar7);
      pGVar4 = Gia_ManObj(pGVar1,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) goto LAB_0049d41f;
      iVar7 = iVar7 + 1;
      if (-1 < *(long *)pGVar4) {
        __assert_fail("pObj->fPhase",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                      ,0x530,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
      }
    }
  }
  else {
    p_00 = Vec_IntAlloc(100);
    for (iVar7 = 0; iVar7 < p->vValues->nSize; iVar7 = iVar7 + 1) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vValues,iVar7);
      pGVar4 = Gia_ManObj(pGVar1,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if ((iVar7 != 0) && (iVar2 = Ga2_ObjIsAbs(p,pGVar4), iVar2 == 0)) {
        if (-1 < *(long *)pGVar4) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x50f,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        iVar2 = Ga2_ObjIsLeaf(p,pGVar4);
        if (iVar2 == 0) {
          __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x510,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        uVar6 = ~*(uint *)pGVar4;
        if (((uVar6 & 0x9fffffff) != 0) && ((int)*(uint *)pGVar4 < 0 || (uVar6 & 0x1fffffff) == 0))
        {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x511,"Vec_Int_t *Ga2_ManRefine(Ga2_Man_t *)");
        }
        iVar2 = Gia_ObjIsPi(p->pGia,pGVar4);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjId(p->pGia,pGVar4);
          Vec_IntPush(p_00,iVar2);
        }
      }
    }
LAB_0049d41f:
    iVar2 = p_00->nSize;
  }
  p->nObjAdded = p->nObjAdded + iVar2;
  return p_00;
}

Assistant:

Vec_Int_t * Ga2_ManRefine( Ga2_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap, * vVec;
    Gia_Obj_t * pObj;
    int i, k;
    if ( p->pPars->fAddLayer )
    {
        // use simplified refinement strategy, which adds logic near at PPI without finding important ones
        vVec = Vec_IntAlloc( 100 );
        Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
        {
            if ( !i ) continue;
            if ( Ga2_ObjIsAbs(p, pObj) )
                continue;
            assert( pObj->fPhase );
            assert( Ga2_ObjIsLeaf(p, pObj) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
            if ( Gia_ObjIsPi(p->pGia, pObj) )
                continue;
            Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
        }
        p->nObjAdded += Vec_IntSize(vVec);
        return vVec;
    }
    Ga2_GlaPrepareCexAndMap( p, &pCex, &vMap );
 //    Rf2_ManRefine( p->pRf2, pCex, vMap, p->pPars->fPropFanout, 1 );
    vVec = Rnm_ManRefine( p->pRnm, pCex, vMap, p->pPars->fPropFanout, p->pPars->fNewRefine, 1 );
//    printf( "Refinement %d\n", Vec_IntSize(vVec) );
    Abc_CexFree( pCex );
    if ( Vec_IntSize(vVec) == 0 )
    {
        Vec_IntFree( vVec );
        Abc_CexFreeP( &p->pGia->pCexSeq );
        p->pGia->pCexSeq = Ga2_ManDeriveCex( p, vMap );
        Vec_IntFree( vMap );
        return NULL;
    }
    Vec_IntFree( vMap );
    // remove those already added
    k = 0;
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        if ( !Ga2_ObjIsAbs(p, pObj) )
            Vec_IntWriteEntry( vVec, k++, Gia_ObjId(p->pGia, pObj) );
    Vec_IntShrink( vVec, k );

    // these objects should be PPIs that are not abstracted yet
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        assert( pObj->fPhase );//&& Ga2_ObjIsLeaf(p, pObj) );
    p->nObjAdded += Vec_IntSize(vVec);
    return vVec;
}